

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

void __thiscall QMimeAllGlobPatterns::removeMimeType(QMimeAllGlobPatterns *this,QString *mimeType)

{
  Span *pSVar1;
  ulong uVar2;
  PatternsMap *__range1;
  long in_FS_OFFSET;
  anon_class_16_1_94f2130c_for__M_pred pred;
  anon_class_16_1_94f2130c_for__M_pred pred_00;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (piter)QHash<QString,_QList<QString>_>::begin(&this->m_fastPatterns);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar1 = (local_30.d)->spans;
    uVar2 = local_30.bucket >> 7;
    QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
              ((QList<QString> *)
               (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)local_30.bucket & 0x7f]].storage.
                data + 0x18),mimeType);
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QList<QString>_>_>::operator++(&local_30);
  }
  pred.mimeType.m_data = (mimeType->d).ptr;
  pred.mimeType.m_size = (mimeType->d).size;
  QList<QMimeGlobPattern>::
  removeIf<QMimeGlobPatternList::removeMimeType(QStringView)::_lambda(QMimeGlobPattern_const&)_1_>
            (&(this->m_highWeightGlobs).super_QList<QMimeGlobPattern>,pred);
  pred_00.mimeType.m_data = (mimeType->d).ptr;
  pred_00.mimeType.m_size = (mimeType->d).size;
  QList<QMimeGlobPattern>::
  removeIf<QMimeGlobPatternList::removeMimeType(QStringView)::_lambda(QMimeGlobPattern_const&)_1_>
            (&(this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>,pred_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::removeMimeType(const QString &mimeType)
{
    for (auto &x : m_fastPatterns)
        x.removeAll(mimeType);
    m_highWeightGlobs.removeMimeType(mimeType);
    m_lowWeightGlobs.removeMimeType(mimeType);
}